

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1540.c
# Opt level: O0

size_t write_callback(void *ptr,size_t size,size_t nmemb,void *userp)

{
  size_t len;
  transfer_status *st;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  ptr_local = (void *)(size * nmemb);
  *(int *)((long)userp + 0xc) = *(int *)((long)userp + 0xc) + 1;
  if (*(int *)((long)userp + 0xc) < 2) {
    curl_mprintf("Got %d bytes but pausing!\n",(ulong)ptr_local & 0xffffffff);
    *(undefined4 *)((long)userp + 8) = 1;
    ptr_local = (void *)0x10000001;
  }
  else {
    fwrite(ptr,size,nmemb,_stdout);
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t write_callback(void *ptr, size_t size, size_t nmemb, void *userp)
{
  struct transfer_status *st = (struct transfer_status *)userp;
  size_t len = size * nmemb;
  st->counter++;
  if(st->counter > 1) {
    /* the first call puts us on pause, so subsequent calls are after
       unpause */
    fwrite(ptr, size, nmemb, stdout);
    return len;
  }
  printf("Got %d bytes but pausing!\n", (int)len);
  st->halted = 1;
  return CURL_WRITEFUNC_PAUSE;
}